

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

QualifiedIdentifier * __thiscall
soul::PoolAllocator::
allocate<soul::AST::QualifiedIdentifier,soul::AST::Context&,soul::IdentifierPath>
          (PoolAllocator *this,Context *args,IdentifierPath *args_1)

{
  PoolItem *pPVar1;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_80;
  
  pPVar1 = allocateSpaceForObject(this,0xa0);
  ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation
            (&local_80,&args_1->pathSections);
  AST::QualifiedIdentifier::QualifiedIdentifier
            ((QualifiedIdentifier *)&pPVar1->item,args,(IdentifierPath *)&local_80);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_80);
  pPVar1->destructor =
       allocate<soul::AST::QualifiedIdentifier,_soul::AST::Context_&,_soul::IdentifierPath>::
       anon_class_1_0_00000001::__invoke;
  return (QualifiedIdentifier *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }